

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O1

wchar_t tty_stty(EditLine *el,wchar_t argc,wchar_t **argv)

{
  uint *puVar1;
  termios *ptVar2;
  int iVar3;
  wchar_t *pwVar4;
  uchar uVar5;
  int iVar6;
  uint uVar7;
  wchar_t wVar8;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  char *pcVar13;
  ttymodes_t *ptVar14;
  wchar_t *pwVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  wchar_t **ppwVar19;
  uint uVar20;
  bool bVar21;
  wchar_t *p;
  char name [1024];
  termios *local_458;
  wchar_t *local_450;
  undefined8 local_448;
  wchar_t local_43c;
  char local_438 [1032];
  
  if (argv == (wchar_t **)0x0) {
    return L'\xffffffff';
  }
  pcVar9 = ct_encode_string(*argv,&el->el_scratch);
  strlcpy(local_438,pcVar9,0x400);
  pwVar15 = argv[1];
  bVar21 = pwVar15 == (wchar_t *)0x0;
  if (bVar21) {
    iVar6 = 0;
    lVar16 = 0;
  }
  else {
    ptVar2 = &(el->el_tty).t_ex;
    ppwVar19 = argv + 1;
    lVar16 = 0;
    local_458 = ptVar2;
    if (*pwVar15 == L'-') {
      iVar6 = 0;
      lVar16 = 0;
      do {
        if (pwVar15[2] != L'\0') break;
        wVar8 = pwVar15[1];
        if (wVar8 < L'q') {
          if (wVar8 == L'a') {
            iVar6 = iVar6 + 1;
          }
          else {
            if (wVar8 != L'd') {
LAB_001137b8:
              fprintf((FILE *)el->el_errfile,"%s: Unknown switch `%lc\'.\n",local_438);
              return L'\xffffffff';
            }
            lVar16 = 1;
            local_458 = &(el->el_tty).t_ed;
          }
        }
        else if (wVar8 == L'q') {
          lVar16 = 2;
          local_458 = &(el->el_tty).t_ts;
        }
        else {
          lVar16 = 0;
          local_458 = ptVar2;
          if (wVar8 != L'x') goto LAB_001137b8;
        }
        pwVar15 = ppwVar19[1];
        bVar21 = pwVar15 == (wchar_t *)0x0;
        if (bVar21) goto LAB_00113359;
        ppwVar19 = ppwVar19 + 1;
      } while (*pwVar15 == L'-');
    }
    else {
      iVar6 = 0;
    }
    if (!bVar21) {
      pwVar15 = *ppwVar19;
      wVar8 = (wchar_t)lVar16;
joined_r0x001134fb:
      local_43c = wVar8;
      if (pwVar15 == (wchar_t *)0x0) {
        tty_setup_flags(el,local_458,wVar8);
        if (wVar8 != (uint)(el->el_tty).t_mode) {
          return L'\0';
        }
        wVar8 = tty_setty(el,L'\x01',local_458);
        if (wVar8 == L'\xffffffff') {
          return L'\xffffffff';
        }
        return L'\0';
      }
      wVar8 = *pwVar15;
      local_448._4_4_ = (uint)(local_448 >> 0x20);
      if ((wVar8 == L'-') || (wVar8 == L'+')) {
        pwVar15 = (wchar_t *)((long)pwVar15 + 4);
        local_448 = CONCAT44(local_448._4_4_,(int)(char)wVar8);
      }
      else {
        local_448 = (ulong)local_448._4_4_ << 0x20;
      }
      ppwVar19 = (wchar_t **)((long)ppwVar19 + 8);
      local_450 = wcschr(pwVar15,L'=');
      bVar21 = false;
      ptVar14 = ttymodes;
      pcVar9 = "ignbrk";
LAB_0011355f:
      pwVar4 = local_450;
      ptVar14 = ptVar14 + 1;
      pcVar13 = ct_encode_string(pwVar15,&el->el_scratch);
      if (pwVar4 == (wchar_t *)0x0) {
        iVar6 = strcmp(pcVar9,pcVar13);
      }
      else {
        iVar6 = strncmp(pcVar9,pcVar13,(long)local_450 - (long)pwVar15 >> 2);
      }
      if ((iVar6 != 0) || ((local_450 != (wchar_t *)0x0 && (ptVar14[-1].m_type != 4))))
      goto LAB_001135ac;
      if (!bVar21) {
        uVar20 = ptVar14[-1].m_value;
        if (local_450 == (wchar_t *)0x0) {
          uVar7 = ~uVar20;
          if ((int)local_448 == 0x2d) {
            iVar6 = ptVar14[-1].m_type;
            puVar1 = &(el->el_tty).t_t[lVar16][iVar6].t_setmask;
            *puVar1 = *puVar1 & uVar7;
            puVar1 = &(el->el_tty).t_t[lVar16][iVar6].t_clrmask;
            *puVar1 = *puVar1 | uVar20;
          }
          else {
            if ((int)local_448 == 0x2b) {
              lVar17 = (long)ptVar14[-1].m_type;
              puVar1 = &(el->el_tty).t_t[lVar16][lVar17].t_setmask;
              *puVar1 = *puVar1 | uVar20;
            }
            else {
              lVar17 = (long)ptVar14[-1].m_type;
              puVar1 = &(el->el_tty).t_t[lVar16][lVar17].t_setmask;
              *puVar1 = *puVar1 & uVar7;
            }
            puVar1 = &(el->el_tty).t_t[lVar16][lVar17].t_clrmask;
            *puVar1 = *puVar1 & uVar7;
          }
          bVar21 = false;
        }
        else {
          if (local_450[1] == L'\0') {
            uVar5 = (el->el_tty).t_vdisable;
            local_450 = local_450 + 1;
          }
          else {
            local_450 = local_450 + 1;
            wVar8 = parse__escape(&local_450);
            uVar5 = (uchar)wVar8;
          }
          if (uVar20 == 0) {
            __assert_fail("c != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/ksherlock[P]libedit/src/tty.c"
                          ,0x4f7,"int tty_stty(EditLine *, int, const wchar_t **)");
          }
          uVar7 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          if (uVar7 < 0x19) {
            uVar12 = (ulong)uVar7;
            switch(uVar12) {
            case 0:
              break;
            case 1:
              uVar12 = 1;
              break;
            case 2:
              uVar12 = 2;
              break;
            case 3:
              uVar12 = 3;
              break;
            case 4:
              uVar12 = 4;
              break;
            case 5:
              uVar12 = 0xb;
              break;
            case 6:
              uVar12 = 0x10;
              break;
            default:
              goto switchD_00113696_caseD_7;
            case 10:
              uVar12 = 8;
              break;
            case 0xb:
              uVar12 = 9;
              break;
            case 0xc:
              uVar12 = 0xe;
              break;
            case 0xd:
              uVar12 = 10;
              break;
            case 0xf:
              uVar12 = 0xc;
              break;
            case 0x10:
              uVar12 = 0xd;
              break;
            case 0x11:
              uVar12 = 0xf;
              break;
            case 0x17:
              uVar12 = 6;
              break;
            case 0x18:
              uVar12 = 5;
            }
            bVar21 = false;
          }
          else {
switchD_00113696_caseD_7:
            uVar12 = 0xffffffffffffffff;
            bVar21 = true;
          }
          if (bVar21) {
            __assert_fail("c != -1",
                          "/workspace/llm4binary/github/license_c_cmakelists/ksherlock[P]libedit/src/tty.c"
                          ,0x4fa,"int tty_stty(EditLine *, int, const wchar_t **)");
          }
          local_458->c_cc[uVar12] = uVar5;
          bVar21 = false;
        }
        goto LAB_001135ed;
      }
      goto LAB_001135c3;
    }
  }
LAB_00113359:
  iVar18 = -1;
  pcVar9 = "ignbrk";
  ptVar14 = ttymodes;
  local_448 = 0;
  sVar10 = 0;
  do {
    ptVar14 = ptVar14 + 1;
    iVar3 = ptVar14[-1].m_type;
    if (iVar3 != iVar18) {
      pcVar13 = "\n";
      if (iVar18 == -1) {
        pcVar13 = "";
      }
      fprintf((FILE *)el->el_outfile,"%s%s",pcVar13,(el->el_tty).t_t[lVar16][iVar3].t_name);
      sVar10 = strlen((el->el_tty).t_t[lVar16][iVar3].t_name);
      iVar18 = iVar3;
      local_448 = sVar10;
    }
    if (iVar18 == -1) {
      uVar20 = 0;
    }
    else {
      uVar20 = (el->el_tty).t_t[lVar16][iVar18].t_setmask & ptVar14[-1].m_value;
      if (uVar20 != 0) {
        uVar20 = 0x2b;
      }
      if (((el->el_tty).t_t[lVar16][iVar18].t_clrmask & ptVar14[-1].m_value) != 0) {
        uVar20 = 0x2d;
      }
    }
    if (uVar20 != 0 || iVar6 != 0) {
      sVar11 = strlen(pcVar9);
      uVar12 = local_448;
      lVar17 = (sVar11 + 1) - (ulong)(uVar20 == 0);
      sVar10 = sVar10 + lVar17 + 1;
      if ((ulong)(long)(el->el_terminal).t_size.h <= sVar10) {
        fprintf((FILE *)el->el_outfile,"\n%*s",local_448 & 0xffffffff,"");
        sVar10 = lVar17 + 1 + uVar12;
      }
      if (uVar20 == 0) {
        fprintf((FILE *)el->el_outfile,"%s ",pcVar9);
      }
      else {
        fprintf((FILE *)el->el_outfile,"%c%s ",(ulong)uVar20,pcVar9);
      }
    }
    pcVar9 = ptVar14->m_name;
  } while (pcVar9 != (char *)0x0);
  fputc(10,(FILE *)el->el_outfile);
  return L'\0';
LAB_001135ac:
  pcVar9 = ptVar14->m_name;
  bVar21 = pcVar9 == (char *)0x0;
  if (bVar21) goto LAB_001135c3;
  goto LAB_0011355f;
LAB_001135c3:
  fprintf((FILE *)el->el_errfile,"%s: Invalid argument `%ls\'.\n",local_438,pwVar15);
  bVar21 = true;
LAB_001135ed:
  if (bVar21) {
    return L'\xffffffff';
  }
  pwVar15 = *ppwVar19;
  wVar8 = local_43c;
  goto joined_r0x001134fb;
}

Assistant:

libedit_private int
/*ARGSUSED*/
tty_stty(EditLine *el, int argc __attribute__((__unused__)),
    const wchar_t **argv)
{
	const ttymodes_t *m;
	char x;
	int aflag = 0;
	const wchar_t *s, *d;
        char name[EL_BUFSIZ];
	struct termios *tios = &el->el_tty.t_ex;
	int z = EX_IO;

	if (argv == NULL)
		return -1;
	strlcpy(name, ct_encode_string(*argv++, &el->el_scratch), sizeof(name));

	while (argv && *argv && argv[0][0] == '-' && argv[0][2] == '\0')
		switch (argv[0][1]) {
		case 'a':
			aflag++;
			argv++;
			break;
		case 'd':
			argv++;
			tios = &el->el_tty.t_ed;
			z = ED_IO;
			break;
		case 'x':
			argv++;
			tios = &el->el_tty.t_ex;
			z = EX_IO;
			break;
		case 'q':
			argv++;
			tios = &el->el_tty.t_ts;
			z = QU_IO;
			break;
		default:
			(void) fprintf(el->el_errfile,
			    "%s: Unknown switch `%lc'.\n",
			    name, (wint_t)argv[0][1]);
			return -1;
		}

	if (!argv || !*argv) {
		int i = -1;
		size_t len = 0, st = 0, cu;
		for (m = ttymodes; m->m_name; m++) {
			if (m->m_type != i) {
				(void) fprintf(el->el_outfile, "%s%s",
				    i != -1 ? "\n" : "",
				    el->el_tty.t_t[z][m->m_type].t_name);
				i = m->m_type;
				st = len =
				    strlen(el->el_tty.t_t[z][m->m_type].t_name);
			}
			if (i != -1) {
			    x = (el->el_tty.t_t[z][i].t_setmask & m->m_value)
				?  '+' : '\0';

			    if (el->el_tty.t_t[z][i].t_clrmask & m->m_value)
				x = '-';
			} else {
			    x = '\0';
			}

			if (x != '\0' || aflag) {

				cu = strlen(m->m_name) + (x != '\0') + 1;

				if (len + cu >=
				    (size_t)el->el_terminal.t_size.h) {
					(void) fprintf(el->el_outfile, "\n%*s",
					    (int)st, "");
					len = st + cu;
				} else
					len += cu;

				if (x != '\0')
					(void) fprintf(el->el_outfile, "%c%s ",
					    x, m->m_name);
				else
					(void) fprintf(el->el_outfile, "%s ",
					    m->m_name);
			}
		}
		(void) fprintf(el->el_outfile, "\n");
		return 0;
	}
	while (argv && (s = *argv++)) {
		const wchar_t *p;
		switch (*s) {
		case '+':
		case '-':
			x = (char)*s++;
			break;
		default:
			x = '\0';
			break;
		}
		d = s;
		p = wcschr(s, L'=');
		for (m = ttymodes; m->m_name; m++)
			if ((p ? strncmp(m->m_name, ct_encode_string(d,
			    &el->el_scratch), (size_t)(p - d)) :
			    strcmp(m->m_name, ct_encode_string(d,
			    &el->el_scratch))) == 0 &&
			    (p == NULL || m->m_type == MD_CHAR))
				break;

		if (!m->m_name) {
			(void) fprintf(el->el_errfile,
			    "%s: Invalid argument `%ls'.\n", name, d);
			return -1;
		}
		if (p) {
			int c = ffs((int)m->m_value);
			int v = *++p ? parse__escape(&p) :
			    el->el_tty.t_vdisable;
			assert(c != 0);
			c--;
			c = tty__getcharindex(c);
			assert(c != -1);
			tios->c_cc[c] = (cc_t)v;
			continue;
		}
		switch (x) {
		case '+':
			el->el_tty.t_t[z][m->m_type].t_setmask |= m->m_value;
			el->el_tty.t_t[z][m->m_type].t_clrmask &= ~m->m_value;
			break;
		case '-':
			el->el_tty.t_t[z][m->m_type].t_setmask &= ~m->m_value;
			el->el_tty.t_t[z][m->m_type].t_clrmask |= m->m_value;
			break;
		default:
			el->el_tty.t_t[z][m->m_type].t_setmask &= ~m->m_value;
			el->el_tty.t_t[z][m->m_type].t_clrmask &= ~m->m_value;
			break;
		}
	}

	tty_setup_flags(el, tios, z);
	if (el->el_tty.t_mode == z) {
		if (tty_setty(el, TCSADRAIN, tios) == -1) {
#ifdef DEBUG_TTY
			(void) fprintf(el->el_errfile, "%s: tty_setty: %s\n",
			    __func__, strerror(errno));
#endif /* DEBUG_TTY */
			return -1;
		}
	}

	return 0;
}